

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Labels.cpp
# Opt level: O0

void __thiscall Labels::displayArrays(Labels *this)

{
  ostream *poVar1;
  void *pvVar2;
  long in_RDI;
  uint i;
  uint local_c;
  
  poVar1 = std::operator<<((ostream *)&std::cerr," Current size ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,current_size);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; local_c < current_size; local_c = local_c + 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"String : ");
    poVar1 = std::operator<<(poVar1,(string *)(labels_string_abi_cxx11_ + local_c));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Counter : ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + (ulong)local_c * 4));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Activated: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(labels_activated[local_c] & 1));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Labels::displayArrays(){
    cerr << " Current size " << current_size << endl;
    for(unsigned int i=0;i<current_size;i++){
        cerr << "String : " << labels_string[i]   << endl;
        cerr << "Counter : " << labels_counter[i]  << endl;
        cerr << "Activated: " << labels_activated[i]<< endl;
    }
}